

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O2

bool __thiscall miniscript::Node<CPubKey>::CheckStackSize(Node<CPubKey> *this)

{
  long lVar1;
  bool bVar2;
  _Optional_base<unsigned_int,_true,_true> _Var3;
  uint uVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = IsTapscript(this->m_script_ctx);
  if (bVar2) {
    _Var3._M_payload.super__Optional_payload_base<unsigned_int> =
         (_Optional_payload<unsigned_int,_true,_true,_true>)GetExecStackSize(this);
    uVar4 = 0x3e9;
  }
  else {
    _Var3._M_payload.super__Optional_payload_base<unsigned_int> =
         (_Optional_payload<unsigned_int,_true,_true,_true>)GetStackSize(this);
    uVar4 = 0x65;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return ((ulong)_Var3._M_payload.super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0 ||
           _Var3._M_payload.super__Optional_payload_base<unsigned_int>._M_payload < uVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool CheckStackSize() const {
        // Since in Tapscript there is no standardness limit on the script and witness sizes, we may run
        // into the maximum stack size while executing the script. Make sure it doesn't happen.
        if (IsTapscript(m_script_ctx)) {
            if (const auto exec_ss = GetExecStackSize()) return exec_ss <= MAX_STACK_SIZE;
            return true;
        }
        if (const auto ss = GetStackSize()) return *ss <= MAX_STANDARD_P2WSH_STACK_ITEMS;
        return true;
    }